

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
__thiscall
duckdb::Deserializer::
ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
          *default_value)

{
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> _Var1;
  _Head_base<0UL,_duckdb::HyperLogLog_*,_false> _Var2;
  int iVar3;
  pointer *__ptr_1;
  undefined6 in_register_00000032;
  Deserializer *deserializer;
  undefined8 *in_R8;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::HyperLogLog_*,_false> local_20;
  
  deserializer = (Deserializer *)CONCAT62(in_register_00000032,field_id);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,(ulong)tag & 0xffffffff,default_value)
  ;
  if ((char)iVar3 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    this->_vptr_Deserializer = (_func_int **)*in_R8;
    *in_R8 = 0;
  }
  else {
    this->_vptr_Deserializer = (_func_int **)0x0;
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 != '\0') {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      DistinctStatistics::Deserialize((DistinctStatistics *)&local_20,deserializer);
      _Var2._M_head_impl = local_20._M_head_impl;
      local_20._M_head_impl = (HyperLogLog *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
      ::reset((__uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
               *)this,(pointer)_Var2._M_head_impl);
      _Var2._M_head_impl = local_20._M_head_impl;
      if ((pointer)local_20._M_head_impl != (pointer)0x0) {
        _Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
             (((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> *)
              (local_20._M_head_impl)->k)->
             super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)._M_t.
             super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
             .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>;
        if (_Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl !=
            (HyperLogLog *)0x0) {
          operator_delete((void *)_Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>.
                                  _M_head_impl);
        }
        operator_delete(_Var2._M_head_impl);
      }
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  return (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         this;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}